

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer-backend-egl.c
# Opt level: O1

wpe_renderer_backend_egl_offscreen_target * wpe_renderer_backend_egl_offscreen_target_create(void)

{
  wpe_renderer_backend_egl_offscreen_target *__ptr;
  wpe_renderer_backend_egl_offscreen_target_interface *pwVar1;
  void *pvVar2;
  
  __ptr = (wpe_renderer_backend_egl_offscreen_target *)calloc(1,0x10);
  if (__ptr != (wpe_renderer_backend_egl_offscreen_target *)0x0) {
    pwVar1 = (wpe_renderer_backend_egl_offscreen_target_interface *)
             wpe_load_object("_wpe_renderer_backend_egl_offscreen_target_interface");
    (__ptr->base).interface = pwVar1;
    if (pwVar1 == (wpe_renderer_backend_egl_offscreen_target_interface *)0x0) {
      free(__ptr);
      __ptr = (wpe_renderer_backend_egl_offscreen_target *)0x0;
    }
    else {
      pvVar2 = (*pwVar1->create)();
      (__ptr->base).interface_data = pvVar2;
    }
    return __ptr;
  }
  wpe_alloc_fail("/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/renderer-backend-egl.c"
                 ,0x94,0x10);
}

Assistant:

struct wpe_renderer_backend_egl_offscreen_target*
wpe_renderer_backend_egl_offscreen_target_create()
{
    struct wpe_renderer_backend_egl_offscreen_target* target =
        wpe_calloc(1, sizeof(struct wpe_renderer_backend_egl_offscreen_target));

    target->base.interface = wpe_load_object("_wpe_renderer_backend_egl_offscreen_target_interface");
    if (!target->base.interface) {
        wpe_free(target);
        return 0;
    }

    target->base.interface_data = target->base.interface->create();

    return target;
}